

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O1

int p256_auth_encap_with_seed
              (EVP_HPKE_KEY *key,uint8_t *out_shared_secret,size_t *out_shared_secret_len,
              uint8_t *out_enc,size_t *out_enc_len,size_t max_enc,uint8_t *peer_public_key,
              size_t peer_public_key_len,uint8_t *seed,size_t seed_len)

{
  int iVar1;
  int line;
  uint8_t dh [64];
  uint8_t kem_context [195];
  uint8_t local_158 [32];
  uint8_t local_138 [32];
  uint8_t local_118 [32];
  undefined1 local_f8 [200];
  
  if (max_enc < 0x41) {
    iVar1 = 0x89;
    line = 0x208;
  }
  else if (seed_len == 0x20) {
    iVar1 = p256_private_key_from_seed(local_158,seed);
    if (iVar1 == 0) {
      return 0;
    }
    p256_public_from_private(out_enc,local_158);
    if (((peer_public_key_len == 0x41) &&
        (iVar1 = p256(local_138,local_158,peer_public_key), iVar1 != 0)) &&
       (iVar1 = p256(local_118,key->private_key,peer_public_key), iVar1 != 0)) {
      memcpy(local_f8,out_enc,0x41);
    }
    iVar1 = 0x86;
    line = 0x219;
  }
  else {
    iVar1 = 0x66;
    line = 0x20c;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,line);
  return 0;
}

Assistant:

static int p256_auth_encap_with_seed(
    const EVP_HPKE_KEY *key, uint8_t *out_shared_secret,
    size_t *out_shared_secret_len, uint8_t *out_enc, size_t *out_enc_len,
    size_t max_enc, const uint8_t *peer_public_key, size_t peer_public_key_len,
    const uint8_t *seed, size_t seed_len) {
  if (max_enc < P256_PUBLIC_VALUE_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_BUFFER_SIZE);
    return 0;
  }
  if (seed_len != P256_SEED_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }
  uint8_t private_key[P256_PRIVATE_KEY_LEN];
  if (!p256_private_key_from_seed(private_key, seed)) {
    return 0;
  }
  p256_public_from_private(out_enc, private_key);

  uint8_t dh[2 * P256_SHARED_KEY_LEN];
  if (peer_public_key_len != P256_PUBLIC_VALUE_LEN ||
      !p256(dh, private_key, peer_public_key) ||
      !p256(dh + P256_SHARED_KEY_LEN, key->private_key, peer_public_key)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_INVALID_PEER_KEY);
    return 0;
  }

  uint8_t kem_context[3 * P256_PUBLIC_VALUE_LEN];
  OPENSSL_memcpy(kem_context, out_enc, P256_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + P256_PUBLIC_VALUE_LEN, peer_public_key,
                 P256_PUBLIC_VALUE_LEN);
  OPENSSL_memcpy(kem_context + 2 * P256_PUBLIC_VALUE_LEN, key->public_key,
                 P256_PUBLIC_VALUE_LEN);
  if (!dhkem_extract_and_expand(key->kem->id, EVP_sha256(), out_shared_secret,
                                SHA256_DIGEST_LENGTH, dh, sizeof(dh),
                                kem_context, sizeof(kem_context))) {
    return 0;
  }

  *out_enc_len = P256_PUBLIC_VALUE_LEN;
  *out_shared_secret_len = SHA256_DIGEST_LENGTH;
  return 1;
}